

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic2::Run(UnitTest_semantic2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Terminator *pTVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string local_78;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"f(a, b)","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"f","");
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_50 + local_48);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_58,(FindName *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a","");
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_50 + local_48);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_58,(FindName *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"b","");
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_50 + local_48);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_58,(FindName *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (pTVar2->semantic_ != SemanticOp_Read) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"\'f->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (pTVar3->semantic_ != SemanticOp_Read) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"\'a->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (pTVar4->semantic_ != SemanticOp_Read) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"\'b->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (local_58._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_58._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic2)
{
    auto ast = Semantic("f(a, b)");
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    EXPECT_TRUE(f->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Read);
}